

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::anon_unknown_0::RoundCaseInstance::getInputValues
          (RoundCaseInstance *this,int numValues,void **values)

{
  float fVar1;
  pointer pSVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  deUint32 dVar7;
  int iVar8;
  Float<unsigned_int,_8,_23,_127,_3U> FVar9;
  void *pvVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  float fVar15;
  int iVar17;
  undefined1 auVar16 [16];
  float fVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  int iVar22;
  undefined1 auVar21 [16];
  Random rnd;
  Float<unsigned_short,_5,_10,_15,_3U> local_8e;
  int local_8c;
  float local_88;
  Float<unsigned_int,_8,_23,_127,_3U> local_84;
  ulong local_80;
  float afStack_78 [8];
  undefined1 local_58 [16];
  deRandom local_40;
  
  afStack_78[1] = 2.0;
  afStack_78[2] = -1000.0;
  afStack_78[3] = 1000.0;
  afStack_78[4] = -1e+07;
  afStack_78[5] = 1e+07;
  dVar7 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar7 ^ 0xac23f);
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar14 = (ulong)*(uint *)((long)&(pSVar2->varType).m_data + 4);
  iVar8 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  auVar6 = _DAT_00a99450;
  auVar5 = _DAT_00a99440;
  auVar4 = _DAT_00a99400;
  if (uVar14 == 0) {
    pvVar10 = *values;
    uVar12 = 0;
    fVar15 = -2.0;
    iVar11 = 0;
  }
  else {
    fVar15 = afStack_78[uVar14 * 2];
    fVar1 = afStack_78[uVar14 * 2 + 1];
    pvVar10 = *values;
    uVar12 = (long)iVar8 + 0x3fffffffffffffffU & 0x3fffffffffffffff;
    auVar16._8_4_ = (int)uVar12;
    auVar16._0_8_ = uVar12;
    auVar16._12_4_ = (int)(uVar12 >> 0x20);
    iVar11 = 0;
    auVar16 = auVar16 ^ _DAT_00a99450;
    do {
      fVar18 = (float)iVar11 + -5.5;
      if (iVar8 != 0) {
        fVar3 = fVar1;
        if (fVar18 <= fVar1) {
          fVar3 = fVar18;
        }
        uVar19 = -(uint)(fVar18 < fVar15) & (uint)fVar15 | ~-(uint)(fVar18 < fVar15) & (uint)fVar3;
        lVar13 = 0;
        do {
          auVar20._8_4_ = (int)lVar13;
          auVar20._0_8_ = lVar13;
          auVar20._12_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar21 = (auVar20 | auVar4) ^ auVar6;
          iVar17 = auVar16._4_4_;
          if ((bool)(~(iVar17 < auVar21._4_4_ ||
                      auVar16._0_4_ < auVar21._0_4_ && auVar21._4_4_ == iVar17) & 1)) {
            *(uint *)((long)pvVar10 + lVar13 * 4) = uVar19;
          }
          if (auVar21._12_4_ <= auVar16._12_4_ &&
              (auVar21._8_4_ <= auVar16._8_4_ || auVar21._12_4_ != auVar16._12_4_)) {
            *(uint *)((long)pvVar10 + lVar13 * 4 + 4) = uVar19;
          }
          auVar20 = (auVar20 | auVar5) ^ auVar6;
          iVar22 = auVar20._4_4_;
          if (iVar22 <= iVar17 && (iVar22 != iVar17 || auVar20._0_4_ <= auVar16._0_4_)) {
            *(uint *)((long)pvVar10 + lVar13 * 4 + 8) = uVar19;
            *(uint *)((long)pvVar10 + lVar13 * 4 + 0xc) = uVar19;
          }
          lVar13 = lVar13 + 4;
        } while ((uVar12 - ((uint)((long)iVar8 + 0x3fffffffffffffffU) & 3)) + 4 != lVar13);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != 10);
    iVar11 = 10;
    uVar12 = uVar14;
  }
  uVar19 = (numValues - iVar11) * iVar8;
  local_8c = numValues;
  local_80 = uVar14;
  if (0 < (int)uVar19) {
    local_88 = afStack_78[uVar12 * 2 + 1] - fVar15;
    uVar14 = 0;
    local_58 = ZEXT416((uint)fVar15);
    do {
      fVar15 = deRandom_getFloat(&local_40);
      *(float *)((long)pvVar10 + uVar14 * 4 + (long)(iVar11 * iVar8) * 4) =
           fVar15 * local_88 + (float)local_58._0_4_;
      uVar14 = uVar14 + 1;
    } while (uVar19 != uVar14);
  }
  if (((int)local_80 == 1) && (uVar19 = iVar8 * local_8c, 0 < (int)uVar19)) {
    pvVar10 = *values;
    uVar14 = 0;
    do {
      local_84.m_value = *(StorageType *)((long)pvVar10 + uVar14 * 4);
      local_8e.m_value = 0;
      local_8e = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>(&local_84)
      ;
      FVar9 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_8e);
      pvVar10 = *values;
      *(StorageType *)((long)pvVar10 + uVar14 * 4) = FVar9.m_value;
      uVar14 = uVar14 + 1;
    } while (uVar19 != uVar14);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd				(deStringHash(m_name) ^ 0xac23fu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		int						numSpecialCases	= 0;

		// Special cases.
		if (precision != glu::PRECISION_LOWP)
		{
			DE_ASSERT(numValues >= 10);
			for (int ndx = 0; ndx < 10; ndx++)
			{
				const float v = de::clamp(float(ndx) - 5.5f, ranges[precision].x(), ranges[precision].y());
				std::fill((float*)values[0], (float*)values[0] + scalarSize, v);
				numSpecialCases += 1;
			}
		}

		// Random cases.
		fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), (float*)values[0] + numSpecialCases*scalarSize, (numValues-numSpecialCases)*scalarSize);

		// If precision is mediump, make sure values can be represented in fp16 exactly
		if (precision == glu::PRECISION_MEDIUMP)
		{
			for (int ndx = 0; ndx < numValues*scalarSize; ndx++)
				((float*)values[0])[ndx] = tcu::Float16(((float*)values[0])[ndx]).asFloat();
		}
	}